

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherInstance::setupDefaultInputs(TextureGatherInstance *this)

{
  size_type sVar1;
  float *pfVar2;
  bool local_85;
  undefined1 local_70 [7];
  bool needNormalizedCoordInShader;
  vector<float,_std::allocator<float>_> texCoord;
  float normalizedCoord [8];
  float position [8];
  int numVertices;
  TextureGatherInstance *this_local;
  
  normalizedCoord[6] = -1.0;
  normalizedCoord[7] = -1.0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  normalizedCoord[0] = 0.0;
  normalizedCoord[1] = 1.0;
  normalizedCoord[2] = 1.0;
  normalizedCoord[3] = 0.0;
  normalizedCoord[4] = 1.0;
  normalizedCoord[5] = 1.0;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[10])
            (local_70,this,(ulong)(uint)this->m_currentIteration);
  local_85 = true;
  if ((this->m_baseParams).gatherType != GATHERTYPE_OFFSET_DYNAMIC) {
    local_85 = isDepthFormat(&(this->m_baseParams).textureFormat);
  }
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32_SFLOAT,8,4,normalizedCoord + 6
            );
  sVar1 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_70);
  if (sVar1 == 8) {
    pfVar2 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)local_70);
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,1,VK_FORMAT_R32G32_SFLOAT,8,4,pfVar2);
  }
  else {
    sVar1 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_70);
    if (sVar1 == 0xc) {
      pfVar2 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)local_70);
      ShaderRenderCaseInstance::addAttribute
                (&this->super_ShaderRenderCaseInstance,1,VK_FORMAT_R32G32B32_SFLOAT,0xc,4,pfVar2);
    }
  }
  if (local_85 != false) {
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,2,VK_FORMAT_R32G32_SFLOAT,8,4,
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_70);
  return;
}

Assistant:

void TextureGatherInstance::setupDefaultInputs (void)
{
	const int				numVertices						= 4;
	const float				position[4*2]					=
	{
		-1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, -1.0f,
		+1.0f, +1.0f,
	};
	const float				normalizedCoord[4*2]			=
	{
		0.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 0.0f,
		1.0f, 1.0f,
	};
	const vector<float>		texCoord						= computeQuadTexCoord(m_currentIteration);
	const bool				needNormalizedCoordInShader		= m_baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC || isDepthFormat(m_baseParams.textureFormat);

	addAttribute(0u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, position);

	if (texCoord.size() == 2*4)
		addAttribute(1u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, texCoord.data());
	else if (texCoord.size() == 3*4)
		addAttribute(1u, vk::VK_FORMAT_R32G32B32_SFLOAT, 3 * (deUint32)sizeof(float), numVertices, texCoord.data());
	else
		DE_ASSERT(false);

	if (needNormalizedCoordInShader)
		addAttribute(2u, vk::VK_FORMAT_R32G32_SFLOAT, 2 * (deUint32)sizeof(float), numVertices, normalizedCoord);
}